

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

spv_result_t
spvOpcodeTableNameLookup
          (spv_target_env env,spv_opcode_table table,char *name,spv_opcode_desc *pEntry)

{
  char *pcVar1;
  uint32_t uVar2;
  int iVar3;
  size_t __n;
  spv_opcode_desc psVar4;
  size_t sVar5;
  size_t aliasLength;
  char *alias;
  uint32_t aliasIndex;
  spv_opcode_desc_t *entry;
  uint64_t opcodeIndex;
  uint32_t version;
  size_t nameLength;
  spv_opcode_desc *pEntry_local;
  char *name_local;
  spv_opcode_table table_local;
  spv_target_env env_local;
  
  if ((name == (char *)0x0) || (pEntry == (spv_opcode_desc *)0x0)) {
    table_local._4_4_ = SPV_ERROR_INVALID_POINTER;
  }
  else if (table == (spv_opcode_table)0x0) {
    table_local._4_4_ = SPV_ERROR_INVALID_TABLE;
  }
  else {
    __n = strlen(name);
    uVar2 = spvVersionForTargetEnv(env);
    for (entry = (spv_opcode_desc_t *)0x0; entry < (spv_opcode_desc_t *)(ulong)table->count;
        entry = (spv_opcode_desc_t *)((long)&entry->name + 1)) {
      psVar4 = table->entries + (long)entry;
      if ((((psVar4->minVersion <= uVar2) && (uVar2 <= psVar4->lastVersion)) ||
          (psVar4->numExtensions != 0)) || (psVar4->numCapabilities != 0)) {
        sVar5 = strlen(psVar4->name);
        if ((__n == sVar5) && (iVar3 = strncmp(name,psVar4->name,__n), iVar3 == 0)) {
          *pEntry = psVar4;
          return SPV_SUCCESS;
        }
        if (psVar4->numAliases != 0) {
          for (alias._4_4_ = 0; alias._4_4_ < psVar4->numAliases; alias._4_4_ = alias._4_4_ + 1) {
            pcVar1 = psVar4->aliases[alias._4_4_];
            sVar5 = strlen(pcVar1 + 2);
            if ((__n == sVar5) && (iVar3 = strncmp(name,pcVar1 + 2,__n), iVar3 == 0)) {
              *pEntry = psVar4;
              return SPV_SUCCESS;
            }
          }
        }
      }
    }
    table_local._4_4_ = SPV_ERROR_INVALID_LOOKUP;
  }
  return table_local._4_4_;
}

Assistant:

spv_result_t spvOpcodeTableNameLookup(spv_target_env env,
                                      const spv_opcode_table table,
                                      const char* name,
                                      spv_opcode_desc* pEntry) {
  if (!name || !pEntry) return SPV_ERROR_INVALID_POINTER;
  if (!table) return SPV_ERROR_INVALID_TABLE;

  // TODO: This lookup of the Opcode table is suboptimal! Binary sort would be
  // preferable but the table requires sorting on the Opcode name, but it's
  // static const initialized and matches the order of the spec.
  const size_t nameLength = strlen(name);
  const auto version = spvVersionForTargetEnv(env);
  for (uint64_t opcodeIndex = 0; opcodeIndex < table->count; ++opcodeIndex) {
    const spv_opcode_desc_t& entry = table->entries[opcodeIndex];
    // We consider the current opcode as available as long as
    // 1. The target environment satisfies the minimal requirement of the
    //    opcode; or
    // 2. There is at least one extension enabling this opcode.
    //
    // Note that the second rule assumes the extension enabling this instruction
    // is indeed requested in the SPIR-V code; checking that should be
    // validator's work.
    if ((version >= entry.minVersion && version <= entry.lastVersion) ||
        entry.numExtensions > 0u || entry.numCapabilities > 0u) {
      // Exact match case.
      if (nameLength == strlen(entry.name) &&
          !strncmp(name, entry.name, nameLength)) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }
      // Lack of binary search really hurts here. There isn't an easy filter to
      // apply before checking aliases since we need to handle promotion from
      // vendor to KHR/EXT and KHR/EXT to core. It would require a sure-fire way
      // of dropping suffices. Fortunately, most lookup are based on token
      // value.
      //
      // If this was a binary search we could iterate between the lower and
      // upper bounds.
      if (entry.numAliases > 0) {
        for (uint32_t aliasIndex = 0; aliasIndex < entry.numAliases;
             aliasIndex++) {
          // Skip Op prefix. Should this be encoded in the table instead?
          const auto alias = entry.aliases[aliasIndex] + 2;
          const size_t aliasLength = strlen(alias);
          if (nameLength == aliasLength && !strncmp(name, alias, nameLength)) {
            *pEntry = &entry;
            return SPV_SUCCESS;
          }
        }
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}